

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.h
# Opt level: O2

void __thiscall cmExportFileGenerator::~cmExportFileGenerator(cmExportFileGenerator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~cmExportFileGenerator() = default;